

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O2

string * __thiscall
RenX_ServerListPlugin::server_as_json_abi_cxx11_
          (string *__return_storage_ptr__,RenX_ServerListPlugin *this,Server *server)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  undefined8 uVar7;
  size_t sVar8;
  undefined8 uVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  pointer pbVar17;
  char *pcVar18;
  char *pcVar19;
  RenX_ServerListPlugin *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  char *pcVar20;
  char *pcVar21;
  undefined4 uVar22;
  string_view sVar23;
  string server_attributes;
  string server_prefix;
  string_view attribute;
  ListServerInfo serverInfo;
  string server_version;
  string server_map;
  string server_name;
  _Alloc_hider local_40;
  char *local_38;
  
  getListServerInfo(&serverInfo,this,server);
  if (serverInfo.hostname._M_len == 0) {
    s_abi_cxx11_(__return_storage_ptr__,"null",4);
  }
  else {
    sVar23 = (string_view)RenX::Server::getName();
    jsonify_abi_cxx11_(&server_name,sVar23);
    lVar6 = RenX::Server::getMap();
    sVar23._M_str = *(char **)(lVar6 + 0x10);
    sVar23._M_len = *(size_t *)(lVar6 + 0x18);
    jsonify_abi_cxx11_(&server_map,sVar23);
    sVar23 = (string_view)RenX::Server::getGameVersion();
    jsonify_abi_cxx11_(&server_version,sVar23);
    jsonify_abi_cxx11_(&server_prefix,serverInfo.namePrefix);
    if (server_prefix._M_string_length != 0) {
      attribute._M_len = 0xe;
      attribute._M_str = "\"NamePrefix\":\"";
      local_40._M_p = (pointer)0x2;
      local_38 = "\",";
      jessilib::
      join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>>
                (&server_attributes,(jessilib *)&attribute,
                 (basic_string_view<char,_std::char_traits<char>_> *)&server_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40,
                 in_R8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&server_prefix,&server_attributes);
      std::__cxx11::string::~string((string *)&server_attributes);
    }
    server_attributes._M_dataplus._M_p = (pointer)&server_attributes.field_2;
    server_attributes._M_string_length = 0;
    server_attributes.field_2._M_local_buf[0] = '\0';
    if (serverInfo.attributes.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        serverInfo.attributes.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                (&server_attributes,
                 (long)serverInfo.attributes.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish +
                 (0x10 - (long)serverInfo.attributes.
                               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (&server_attributes,"\"Attributes\":[");
      for (pbVar17 = serverInfo.attributes.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar17 !=
          serverInfo.attributes.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar17 = pbVar17 + 1) {
        attribute._M_len = pbVar17->_M_len;
        attribute._M_str = pbVar17->_M_str;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&server_attributes,'\"');
        std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                  ((string *)&server_attributes,&attribute);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&server_attributes,"\",");
      }
      server_attributes._M_dataplus._M_p[server_attributes._M_string_length - 1] = ']';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&server_attributes,',');
    }
    this_00 = (RenX_ServerListPlugin *)server;
    uVar7 = RenX::Server::getBotCount();
    sVar8 = getListedPlayerCount(this_00,server);
    sVar2 = server_attributes._M_string_length;
    _Var1 = server_attributes._M_dataplus;
    uVar9 = RenX::Server::getMineLimit();
    cVar3 = RenX::Server::isSteamRequired();
    pcVar18 = "false";
    pcVar10 = "false";
    if (cVar3 != '\0') {
      pcVar10 = "true";
    }
    cVar3 = RenX::Server::isPrivateMessageTeamOnly();
    pcVar11 = "false";
    if (cVar3 != '\0') {
      pcVar11 = "true";
    }
    cVar3 = RenX::Server::isPassworded();
    pcVar12 = "false";
    if (cVar3 != '\0') {
      pcVar12 = "true";
    }
    cVar3 = RenX::Server::isPrivateMessagingEnabled();
    pcVar19 = "false";
    if (cVar3 != '\0') {
      pcVar19 = "true";
    }
    cVar3 = RenX::Server::isRanked();
    pcVar21 = "false";
    if (cVar3 != '\0') {
      pcVar21 = "true";
    }
    uVar13 = RenX::Server::getGameType();
    uVar14 = RenX::Server::getPlayerLimit();
    uVar15 = RenX::Server::getVehicleLimit();
    iVar4 = RenX::Server::getTeamMode();
    pcVar20 = "false";
    if (iVar4 == 3) {
      pcVar20 = "true";
    }
    uVar16 = RenX::Server::getTeamMode();
    cVar3 = RenX::Server::isCratesEnabled();
    if (cVar3 != '\0') {
      pcVar18 = "true";
    }
    uVar22 = RenX::Server::getCrateRespawnDelay();
    uVar5 = RenX::Server::getTimeLimit();
    string_printf_abi_cxx11_
              (__return_storage_ptr__,
               "{\"Name\":\"%.*s\",%.*s\"Current Map\":\"%.*s\",\"Bots\":%u,\"Players\":%u,\"Game Version\":\"%.*s\",%.*s\"Variables\":{\"Mine Limit\":%d,\"bSteamRequired\":%s,\"bPrivateMessageTeamOnly\":%s,\"bPassworded\":%s,\"bAllowPrivateMessaging\":%s,\"bRanked\":%s,\"Game Type\":%d,\"Player Limit\":%d,\"Vehicle Limit\":%d,\"bAutoBalanceTeams\":%s,\"Team Mode\":%d,\"bSpawnCrates\":%s,\"CrateRespawnAfterPickup\":%f,\"Time Limit\":%d},\"Port\":%u,\"IP\":\"%.*s\""
               ,uVar22,server_name._M_string_length,server_name._M_dataplus._M_p,
               server_prefix._M_string_length,server_prefix._M_dataplus._M_p,
               server_map._M_string_length,server_map._M_dataplus._M_p,uVar7,sVar8,
               server_version._M_string_length,server_version._M_dataplus._M_p,sVar2,_Var1._M_p,
               uVar9,pcVar10,pcVar11,pcVar12,pcVar19,pcVar21,uVar13,uVar14,uVar15,pcVar20,uVar16,
               pcVar18,(ulong)uVar5,(ulong)serverInfo.port,serverInfo.hostname._M_len,
               serverInfo.hostname._M_str);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,'}');
    std::__cxx11::string::~string((string *)&server_attributes);
    std::__cxx11::string::~string((string *)&server_prefix);
    std::__cxx11::string::~string((string *)&server_version);
    std::__cxx11::string::~string((string *)&server_map);
    std::__cxx11::string::~string((string *)&server_name);
  }
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&serverInfo.attributes.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 );
  return __return_storage_ptr__;
}

Assistant:

std::string RenX_ServerListPlugin::server_as_json(const RenX::Server &server) {
	ListServerInfo serverInfo = getListServerInfo(server);

	if (serverInfo.hostname.empty()) {
		return "null"s;
	}

	std::string server_name = jsonify(server.getName());
	std::string server_map = jsonify(server.getMap().name);
	std::string server_version = jsonify(server.getGameVersion());
	std::string_view server_hostname = serverInfo.hostname;
	unsigned short server_port = serverInfo.port;
	std::string server_prefix = jsonify(serverInfo.namePrefix);

	// Some members we only include if they're populated
	if (!server_prefix.empty()) {
		server_prefix = jessilib::join<std::string>(R"json("NamePrefix":")json"sv, server_prefix, "\","sv);
	}

	std::string server_attributes;
	if (!serverInfo.attributes.empty()) {
		server_attributes.reserve(16 * serverInfo.attributes.size() + 16);
		server_attributes = R"json("Attributes":[)json";

		for (std::string_view attribute : serverInfo.attributes) {
			server_attributes += '\"';
			server_attributes += attribute;
			server_attributes += "\",";
		}

		server_attributes.back() = ']';
		server_attributes += ',';
	}

	// Build block
	std::string server_json_block = string_printf(R"json({"Name":"%.*s",%.*s"Current Map":"%.*s","Bots":%u,"Players":%u,"Game Version":"%.*s",%.*s"Variables":{"Mine Limit":%d,"bSteamRequired":%s,"bPrivateMessageTeamOnly":%s,"bPassworded":%s,"bAllowPrivateMessaging":%s,"bRanked":%s,"Game Type":%d,"Player Limit":%d,"Vehicle Limit":%d,"bAutoBalanceTeams":%s,"Team Mode":%d,"bSpawnCrates":%s,"CrateRespawnAfterPickup":%f,"Time Limit":%d},"Port":%u,"IP":"%.*s")json",
		server_name.size(), server_name.data(),
		server_prefix.size(), server_prefix.data(),
		server_map.size(), server_map.data(),
		server.getBotCount(),
		getListedPlayerCount(server),
		server_version.size(), server_version.data(),
		server_attributes.size(), server_attributes.data(),
		server.getMineLimit(),
		json_bool_as_cstring(server.isSteamRequired()),
		json_bool_as_cstring(server.isPrivateMessageTeamOnly()),
		json_bool_as_cstring(server.isPassworded()),
		json_bool_as_cstring(server.isPrivateMessagingEnabled()),
		json_bool_as_cstring(server.isRanked()),
		server.getGameType(),
		server.getPlayerLimit(),
		server.getVehicleLimit(),
		json_bool_as_cstring(server.getTeamMode() == 3),
		server.getTeamMode(),
		json_bool_as_cstring(server.isCratesEnabled()),
		server.getCrateRespawnDelay(),
		server.getTimeLimit(),
		server_port,
		server_hostname.size(), server_hostname.data());

	server_json_block += '}';

	return server_json_block;
}